

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O0

NativeDisplay * __thiscall
tcu::x11::egl::DisplayFactory::createDisplay(DisplayFactory *this,EGLAttrib *attribList)

{
  XlibDisplay *this_00;
  Display *this_01;
  MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> local_48;
  DefaultDeleter<tcu::x11::XlibDisplay> local_35 [13];
  undefined1 local_28 [8];
  MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> x11Display;
  EGLAttrib *attribList_local;
  DisplayFactory *this_local;
  
  x11Display.super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>.
  m_data._8_8_ = attribList;
  this_00 = (XlibDisplay *)operator_new(0x20);
  XlibDisplay::XlibDisplay(this_00,this->m_eventState,(char *)0x0);
  de::DefaultDeleter<tcu::x11::XlibDisplay>::DefaultDeleter(local_35);
  de::details::MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>::MovePtr
            ((MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *)local_28,
             this_00);
  this_01 = (Display *)operator_new(0x228);
  de::details::MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>::MovePtr
            (&local_48,
             (MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *)local_28)
  ;
  Display::Display(this_01,&local_48);
  de::details::MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>::~MovePtr
            (&local_48);
  de::details::MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>::~MovePtr
            ((MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *)local_28)
  ;
  return &this_01->super_NativeDisplay;
}

Assistant:

NativeDisplay* DisplayFactory::createDisplay (const eglw::EGLAttrib* attribList) const
{
	DE_UNREF(attribList);

	//! \todo [2014-03-18 lauri] Somehow make the display configurable from command line
	MovePtr<XlibDisplay>	x11Display	(new XlibDisplay(m_eventState, DE_NULL));

	return new Display(x11Display);
}